

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O0

void serialization::unserialize_helper<serialization::xml_iarchive,int>
               (xml_iarchive *ar,vector<int,_std::allocator<int>_> *v)

{
  int local_2c;
  uint local_28;
  int tmp;
  size_type i;
  size_type size;
  vector<int,_std::allocator<int>_> *pvStack_18;
  serialization_trace trace;
  vector<int,_std::allocator<int>_> *v_local;
  xml_iarchive *ar_local;
  
  i = 0xa8;
  pvStack_18 = v;
  serialization_trace::serialization_trace<char_const(&)[19],char_const(&)[140],int>
            ((serialization_trace *)((long)&size + 3),(char (*) [19])"unserialize_helper",
             (char (*) [140])
             "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/serialization_helper.h"
             ,(int *)&i);
  tmp = xml_iarchive::load_sequence_start(ar);
  std::vector<int,_std::allocator<int>_>::reserve(pvStack_18,(ulong)(uint)tmp);
  for (local_28 = 0; local_28 < (uint)tmp; local_28 = local_28 + 1) {
    xml_iarchive::load_sequence_item_start(ar,local_28);
    unserialize_helper<serialization::xml_iarchive,int>(ar,&local_2c);
    std::vector<int,_std::allocator<int>_>::push_back(pvStack_18,&local_2c);
    xml_iarchive::load_sequence_item_end(ar);
  }
  xml_iarchive::load_sequence_end(ar);
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::vector<T> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    v.reserve(size);
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        T tmp;
        unserialize_helper(ar, tmp);
        v.push_back(std::move(tmp));
        ar.load_sequence_item_end();
    }

    ar.load_sequence_end();
}